

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

void INT_CM_fd_add_select
               (CManager_conflict cm,int fd,select_list_func handler_func,void *param1,void *param2)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  timespec ts;
  timespec local_38;
  
  if (handler_func != (select_list_func)0x0) {
    if (cm->control_list->select_initialized == 0) {
      CM_init_select(cm->control_list,cm);
    }
    (*cm->control_list->add_select)
              (&CMstatic_trans_svcs,&cm->control_list->select_data,fd,handler_func,param1,param2);
    return;
  }
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,EVWarning);
    if (iVar1 == 0) goto LAB_00114a66;
  }
  else if (CMtrace_val[0xb] == 0) goto LAB_00114a66;
  if (CMtrace_PID != 0) {
    __stream = (FILE *)cm->CMTrace_file;
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_38);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
  }
  fwrite("INT_CM_fd_add_select called with bogus notification function; ignored\n",0x46,1,
         (FILE *)cm->CMTrace_file);
LAB_00114a66:
  fflush((FILE *)cm->CMTrace_file);
  return;
}

Assistant:

extern void
 INT_CM_fd_add_select(CManager cm, SOCKET fd, select_list_func handler_func,
		      void *param1, void *param2)
 {
     if (!handler_func) {
	 CMtrace_out(cm, EVWarning, "INT_CM_fd_add_select called with bogus notification function; ignored\n");
	 return;
     }
     if (!cm->control_list->select_initialized) {
	 CM_init_select(cm->control_list, cm);
     }
     cm->control_list->add_select(&CMstatic_trans_svcs,
				  &cm->control_list->select_data, fd,
				  handler_func, param1, param2);
 }